

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

void luaG_errormsg(lua_State *L)

{
  Value *pVVar1;
  long lVar2;
  StkId pTVar3;
  StkId pTVar4;
  Value VVar5;
  int iVar6;
  undefined4 uVar7;
  
  lVar2 = L->errfunc;
  if (lVar2 != 0) {
    pTVar3 = L->top;
    pTVar4 = L->stack;
    iVar6 = pTVar3[-1].tt_;
    uVar7 = *(undefined4 *)&pTVar3[-1].field_0xc;
    pTVar3->value_ = pTVar3[-1].value_;
    pTVar3->tt_ = iVar6;
    *(undefined4 *)&pTVar3->field_0xc = uVar7;
    pTVar3 = L->top;
    pVVar1 = (Value *)((long)&pTVar4->value_ + lVar2);
    VVar5 = pVVar1[1];
    pTVar3[-1].value_ = *pVVar1;
    *(Value *)&pTVar3[-1].tt_ = VVar5;
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    luaD_callnoyield(L,pTVar3 + -1,1);
  }
  luaD_throw(L,2);
}

Assistant:

l_noret luaG_errormsg(lua_State *L) {
    if (L->errfunc != 0) {  /* is there an error handling function? */
        StkId errfunc = restorestack(L, L->errfunc);
        setobjs2s(L, L->top, L->top - 1);  /* move argument */
        setobjs2s(L, L->top - 1, errfunc);  /* push function */
        L->top++;  /* assume EXTRA_STACK */
        luaD_callnoyield(L, L->top - 2, 1);  /* call it */
    }
    luaD_throw(L, LUA_ERRRUN);
}